

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O0

void test_server_init(void)

{
  cio_error cVar1;
  cio_inet_address *arg1;
  undefined1 local_5d8 [4];
  cio_error err;
  cio_http_server_configuration config;
  server_init_arguments args;
  uint i;
  server_init_arguments server_init_arguments [11];
  cio_http_server server;
  
  server_init_arguments[0].server = (cio_http_server *)&loop;
  server_init_arguments[0].loop = (cio_eventloop *)serve_error;
  server_init_arguments[0].serve_error = (_func_void_cio_http_server_ptr_char_ptr *)0x12a05f200;
  server_init_arguments[0].header_read_timeout = 5000000000;
  server_init_arguments[0].body_read_timeout = 5000000000;
  server_init_arguments[0].response_timeout = (uint64_t)alloc_dummy_client;
  server_init_arguments[0].alloc_client = free_dummy_client;
  server_init_arguments[0].free_client = cio_server_socket_init_ok;
  server_init_arguments[0].server_socket_init._0_1_ = 0;
  server_init_arguments[0].server_socket_init._4_4_ = 0;
  server_init_arguments[0]._72_8_ = &server_init_arguments[10].enable_fast_open;
  server_init_arguments[1].server = (cio_http_server *)&loop;
  server_init_arguments[1].loop = (cio_eventloop *)serve_error;
  server_init_arguments[1].serve_error = (_func_void_cio_http_server_ptr_char_ptr *)0x12a05f200;
  server_init_arguments[1].header_read_timeout = 5000000000;
  server_init_arguments[1].body_read_timeout = 5000000000;
  server_init_arguments[1].response_timeout = (uint64_t)alloc_dummy_client;
  server_init_arguments[1].alloc_client = free_dummy_client;
  server_init_arguments[1].free_client = cio_server_socket_init_ok;
  server_init_arguments[1].server_socket_init._0_1_ = 1;
  server_init_arguments[1].server_socket_init._4_4_ = 0;
  server_init_arguments[1].enable_fast_open = false;
  server_init_arguments[1]._73_3_ = 0;
  server_init_arguments[1].expected_result = CIO_SUCCESS;
  server_init_arguments[2].server = (cio_http_server *)&loop;
  server_init_arguments[2].loop = (cio_eventloop *)serve_error;
  server_init_arguments[2].serve_error = (_func_void_cio_http_server_ptr_char_ptr *)0x12a05f200;
  server_init_arguments[2].header_read_timeout = 5000000000;
  server_init_arguments[2].body_read_timeout = 5000000000;
  server_init_arguments[2].response_timeout = (uint64_t)alloc_dummy_client;
  server_init_arguments[2].alloc_client = free_dummy_client;
  server_init_arguments[2].free_client = cio_server_socket_init_ok;
  server_init_arguments[2].server_socket_init._0_1_ = 0;
  server_init_arguments[2].server_socket_init._4_4_ = 0xffffffea;
  server_init_arguments[2]._72_8_ = &server_init_arguments[10].enable_fast_open;
  server_init_arguments[3].server = (cio_http_server *)0x0;
  server_init_arguments[3].loop = (cio_eventloop *)serve_error;
  server_init_arguments[3].serve_error = (_func_void_cio_http_server_ptr_char_ptr *)0x12a05f200;
  server_init_arguments[3].header_read_timeout = 5000000000;
  server_init_arguments[3].body_read_timeout = 5000000000;
  server_init_arguments[3].response_timeout = (uint64_t)alloc_dummy_client;
  server_init_arguments[3].alloc_client = free_dummy_client;
  server_init_arguments[3].free_client = cio_server_socket_init_ok;
  server_init_arguments[3].server_socket_init._0_1_ = 0;
  server_init_arguments[3].server_socket_init._4_4_ = 0xffffffea;
  server_init_arguments[3]._72_8_ = &server_init_arguments[10].enable_fast_open;
  server_init_arguments[4].server = (cio_http_server *)&loop;
  server_init_arguments[4].loop = (cio_eventloop *)0x0;
  server_init_arguments[4].serve_error = (_func_void_cio_http_server_ptr_char_ptr *)0x12a05f200;
  server_init_arguments[4].header_read_timeout = 5000000000;
  server_init_arguments[4].body_read_timeout = 5000000000;
  server_init_arguments[4].response_timeout = (uint64_t)alloc_dummy_client;
  server_init_arguments[4].alloc_client = free_dummy_client;
  server_init_arguments[4].free_client = cio_server_socket_init_ok;
  server_init_arguments[4].server_socket_init._0_1_ = 0;
  server_init_arguments[4].server_socket_init._4_4_ = 0;
  server_init_arguments[4]._72_8_ = &server_init_arguments[10].enable_fast_open;
  server_init_arguments[5].server = (cio_http_server *)&loop;
  server_init_arguments[5].loop = (cio_eventloop *)serve_error;
  server_init_arguments[5].serve_error = (_func_void_cio_http_server_ptr_char_ptr *)0x0;
  server_init_arguments[5].header_read_timeout = 5000000000;
  server_init_arguments[5].body_read_timeout = 5000000000;
  server_init_arguments[5].response_timeout = (uint64_t)alloc_dummy_client;
  server_init_arguments[5].alloc_client = free_dummy_client;
  server_init_arguments[5].free_client = cio_server_socket_init_ok;
  server_init_arguments[5].server_socket_init._0_1_ = 0;
  server_init_arguments[5].server_socket_init._4_4_ = 0xffffffea;
  server_init_arguments[5]._72_8_ = &server_init_arguments[10].enable_fast_open;
  server_init_arguments[6].server = (cio_http_server *)&loop;
  server_init_arguments[6].loop = (cio_eventloop *)serve_error;
  server_init_arguments[6].serve_error = (_func_void_cio_http_server_ptr_char_ptr *)0x12a05f200;
  server_init_arguments[6].header_read_timeout = 0;
  server_init_arguments[6].body_read_timeout = 5000000000;
  server_init_arguments[6].response_timeout = (uint64_t)alloc_dummy_client;
  server_init_arguments[6].alloc_client = free_dummy_client;
  server_init_arguments[6].free_client = cio_server_socket_init_ok;
  server_init_arguments[6].server_socket_init._0_1_ = 0;
  server_init_arguments[6].server_socket_init._4_4_ = 0xffffffea;
  server_init_arguments[6]._72_8_ = &server_init_arguments[10].enable_fast_open;
  server_init_arguments[7].server = (cio_http_server *)&loop;
  server_init_arguments[7].loop = (cio_eventloop *)serve_error;
  server_init_arguments[7].serve_error = (_func_void_cio_http_server_ptr_char_ptr *)0x12a05f200;
  server_init_arguments[7].header_read_timeout = 5000000000;
  server_init_arguments[7].body_read_timeout = 0;
  server_init_arguments[7].response_timeout = (uint64_t)alloc_dummy_client;
  server_init_arguments[7].alloc_client = free_dummy_client;
  server_init_arguments[7].free_client = cio_server_socket_init_ok;
  server_init_arguments[7].server_socket_init._0_1_ = 0;
  server_init_arguments[7].server_socket_init._4_4_ = 0xffffffea;
  server_init_arguments[7]._72_8_ = &server_init_arguments[10].enable_fast_open;
  server_init_arguments[8].server = (cio_http_server *)&loop;
  server_init_arguments[8].loop = (cio_eventloop *)serve_error;
  server_init_arguments[8].serve_error = (_func_void_cio_http_server_ptr_char_ptr *)0x12a05f200;
  server_init_arguments[8].header_read_timeout = 5000000000;
  server_init_arguments[8].body_read_timeout = 5000000000;
  server_init_arguments[8].response_timeout = 0;
  server_init_arguments[8].alloc_client = free_dummy_client;
  server_init_arguments[8].free_client = cio_server_socket_init_ok;
  server_init_arguments[8].server_socket_init._0_1_ = 0;
  server_init_arguments[8].server_socket_init._4_4_ = 0xffffffea;
  server_init_arguments[8]._72_8_ = &server_init_arguments[10].enable_fast_open;
  server_init_arguments[9].server = (cio_http_server *)&loop;
  server_init_arguments[9].loop = (cio_eventloop *)serve_error;
  server_init_arguments[9].serve_error = (_func_void_cio_http_server_ptr_char_ptr *)0x12a05f200;
  server_init_arguments[9].header_read_timeout = 5000000000;
  server_init_arguments[9].body_read_timeout = 5000000000;
  server_init_arguments[9].response_timeout = (uint64_t)alloc_dummy_client;
  server_init_arguments[9].alloc_client = (_func_cio_socket_ptr *)0x0;
  server_init_arguments[9].free_client = cio_server_socket_init_ok;
  server_init_arguments[9].server_socket_init._0_1_ = 0;
  server_init_arguments[9].server_socket_init._4_4_ = 0xffffffea;
  server_init_arguments[9]._72_8_ = &server_init_arguments[10].enable_fast_open;
  server_init_arguments[10].server = (cio_http_server *)&loop;
  server_init_arguments[10].loop = (cio_eventloop *)serve_error;
  server_init_arguments[10].serve_error = (_func_void_cio_http_server_ptr_char_ptr *)0x12a05f200;
  server_init_arguments[10].header_read_timeout = 5000000000;
  server_init_arguments[10].body_read_timeout = 5000000000;
  server_init_arguments[10].response_timeout = (uint64_t)alloc_dummy_client;
  server_init_arguments[10].alloc_client = free_dummy_client;
  server_init_arguments[10].free_client = cio_server_socket_init_fails;
  server_init_arguments[10].server_socket_init._0_1_ = 0;
  server_init_arguments[10].server_socket_init._4_4_ = 0xffffffea;
  for (args.expected_result = CIO_SUCCESS; (uint)args.expected_result < 0xb;
      args.expected_result = args.expected_result + CIO_EOF) {
    memcpy(&config.free_client,
           &server_init_arguments[(ulong)(uint)args.expected_result - 1].enable_fast_open,0x50);
    cio_server_socket_init_fake.custom_fake =
         (_func_cio_error_cio_server_socket_ptr_cio_eventloop_ptr_uint_cio_address_family_cio_alloc_client_t_cio_free_client_t_uint64_t_cio_server_socket_close_hook_t
          *)args.free_client;
    memset(local_5d8,0,0x74);
    config.response_timeout_ns = 10;
    config.close_timeout_ns._0_1_ = (byte)args.server_socket_init & 1;
    arg1 = cio_get_inet_address_any4();
    cio_init_inet_socket_address((cio_socket_address *)local_5d8,arg1,0x1f90);
    cVar1 = cio_http_server_init
                      ((cio_http_server *)config.free_client,(cio_eventloop *)args.server,
                       (cio_http_server_configuration *)local_5d8);
    UnityAssertEqualNumber
              ((long)args.server_socket_init._4_4_,(long)cVar1,"Initialization failed!",0x3da,
               UNITY_DISPLAY_STYLE_INT);
    if (((byte)args.server_socket_init & 1) != 0) {
      UnityAssertEqualNumber
                (1,(ulong)cio_server_socket_set_tcp_fast_open_fake.call_count,
                 "TCP FAST OPEN was not configured!",0x3dc,UNITY_DISPLAY_STYLE_INT);
    }
    free_dummy_client(client_socket);
    setUp();
  }
  free_dummy_client(client_socket);
  return;
}

Assistant:

static void test_server_init(void)
{
	struct server_init_arguments {
		struct cio_http_server *server;
		struct cio_eventloop *loop;
		void (*serve_error)(struct cio_http_server *server, const char *reason);
		uint64_t header_read_timeout;
		uint64_t body_read_timeout;
		uint64_t response_timeout;
		struct cio_socket *(*alloc_client)(void);
		void (*free_client)(struct cio_socket *socket);
		enum cio_error (*server_socket_init)(struct cio_server_socket *ss, struct cio_eventloop *loop, unsigned int backlog, enum cio_address_family family, cio_alloc_client_t alloc_client, cio_free_client_t free_client, uint64_t close_timeout_ns, cio_server_socket_close_hook_t close_hook);
		bool enable_fast_open;
		enum cio_error expected_result;
	};

	struct cio_http_server server;
	struct server_init_arguments server_init_arguments[] = {
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_SUCCESS},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = true, .expected_result = CIO_SUCCESS},
	    {.server = NULL, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = NULL, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = NULL, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_SUCCESS},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = 0, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = 0, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = 0, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = NULL, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = NULL, .server_socket_init = cio_server_socket_init_ok, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	    {.server = &server, .loop = &loop, .serve_error = serve_error, .header_read_timeout = header_read_timeout, .body_read_timeout = body_read_timeout, .response_timeout = response_timeout, .alloc_client = alloc_dummy_client, .free_client = free_dummy_client, .server_socket_init = cio_server_socket_init_fails, .enable_fast_open = false, .expected_result = CIO_INVALID_ARGUMENT},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(server_init_arguments); i++) {
		struct server_init_arguments args = server_init_arguments[i];
		cio_server_socket_init_fake.custom_fake = args.server_socket_init;

		struct cio_http_server_configuration config = {
		    .on_error = args.serve_error,
		    .read_header_timeout_ns = args.header_read_timeout,
		    .read_body_timeout_ns = args.body_read_timeout,
		    .response_timeout_ns = args.response_timeout,
		    .close_timeout_ns = 10,
		    .use_tcp_fastopen = args.enable_fast_open,
		    .alloc_client = args.alloc_client,
		    .free_client = args.free_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

		enum cio_error err = cio_http_server_init(args.server, args.loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(args.expected_result, err, "Initialization failed!");
		if (args.enable_fast_open) {
			TEST_ASSERT_EQUAL_MESSAGE(1, cio_server_socket_set_tcp_fast_open_fake.call_count, "TCP FAST OPEN was not configured!");
		}

		free_dummy_client(client_socket);
		setUp();
	}

	free_dummy_client(client_socket);
}